

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O2

int __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::init
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
  *pDVar2;
  int in_ECX;
  uint in_EDX;
  string sStack_68;
  string local_48 [32];
  
  if (in_ECX == 0) {
    pDVar2 = (DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              *)operator_new(0x228);
    std::__cxx11::string::string((string *)&sStack_68,(string *)ctx);
    DynamicFileManager<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
    ::DynamicFileManager(pDVar2,&sStack_68,in_EDX);
    this->file = pDVar2;
    std::__cxx11::string::~string((string *)&sStack_68);
    if ((this->file->
        super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
        ).is_newfile != true) {
      getfromcache(this);
      return extraout_EAX;
    }
    iVar1 = (*(this->file->
              super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
              )._vptr_FileManager_Base[1])();
  }
  else {
    pDVar2 = this->file;
    std::__cxx11::string::string(local_48,(string *)ctx);
    (**(pDVar2->
       super_FileManager_Base<sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::node>
       )._vptr_FileManager_Base)(pDVar2,local_48,(ulong)in_EDX,1);
    iVar1 = std::__cxx11::string::~string(local_48);
  }
  this->root = -1;
  this->depth = 0;
  this->siz = 0;
  return iVar1;
}

Assistant:

void init(std::string str , unsigned int cache_size , bool is_reset = false)
        {
            if (is_reset) {
                file->init(str, cache_size , true);
                root = -1,depth = 0,siz=0;
            } else {
                file = new DynamicFileManager<node>(str , cache_size);
                if (file->is_newfile)
		{
                	file->newspace();
			root = - 1 , depth = 0 , siz = 0;
		}
                else
                    getfromcache();
            }
        }